

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

_List_iterator<cs_impl::any> __thiscall
cs_impl::
cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::_call<0>(cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  _List_iterator<cs_impl::any> *p_Var1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  var *in_stack_000000f0;
  _List_iterator<cs_impl::any> in_stack_ffffffffffffffd8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
  ::convert(in_stack_000000f0);
  std::
  function<std::_List_iterator<cs_impl::any>_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::operator()((function<std::_List_iterator<cs_impl::any>_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)in_stack_ffffffffffffffd8._M_node,in_RDI);
  p_Var1 = type_convertor<std::_List_iterator<cs_impl::any>,std::_List_iterator<cs_impl::any>>::
           convert<std::_List_iterator<cs_impl::any>>
                     ((_List_iterator<cs_impl::any> *)&stack0xffffffffffffffd8);
  return (_List_iterator<cs_impl::any>)p_Var1->_M_node;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}